

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O2

void ear::
     mask_write<ear::OutputGains&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (OutputGains *out,
               CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
               *mask,Matrix<double,__1,_1,_0,__1,_1> *values)

{
  long lVar1;
  CoeffReturnType CVar2;
  int iVar3;
  undefined4 extraout_var;
  CoeffReturnType pdVar4;
  long index;
  long lVar5;
  long lVar6;
  long index_00;
  
  iVar3 = (*out->_vptr_OutputGains[1])();
  lVar6 = (mask->m_xpr->super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  lVar1 = (values->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  _assert_impl(CONCAT44(extraout_var,iVar3) == lVar6,
               "in mask_write: out_size and mask_write must be the same length");
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  index = 0;
  for (index_00 = 0; lVar6 != index_00; index_00 = index_00 + 1) {
    CVar2 = Eigen::
            DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>,_0>
                          *)mask,index_00);
    lVar5 = index;
    if (CVar2) {
      lVar5 = index + 1;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)values,index
                         );
      (*out->_vptr_OutputGains[2])(*pdVar4,out,index_00);
    }
    index = lVar5;
  }
  _assert_impl(index == lVar1,
               "in mask_size: length of values must equal the number of entries in mask");
  return;
}

Assistant:

void mask_write(OutT &&out, const MaskT &mask, const ValuesT &values) {
    Eigen::Index out_size = out.size();
    Eigen::Index mask_size = mask.size();
    Eigen::Index values_size = values.size();

    ear_assert(
        out_size == mask_size,
        "in mask_write: out_size and mask_write must be the same length");

    Eigen::Index j = 0;
    for (Eigen::Index i = 0; i < mask_size; i++)
      if (mask[i]) vec_write(out, i, values[j++]);

    ear_assert(j == values_size,
               "in mask_size: length of values must equal the number of "
               "entries in mask");
  }